

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

cmMakefileTargetGenerator * cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)

{
  int iVar1;
  cmMakefileLibraryTargetGenerator *this;
  
  iVar1 = cmGeneratorTarget::GetType(tgt);
  if (iVar1 - 1U < 4) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x3f0);
    cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(this,tgt);
  }
  else if (iVar1 == 5) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x3d0);
    cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
              ((cmMakefileUtilityTargetGenerator *)this,tgt);
  }
  else if (iVar1 == 0) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x3d0);
    cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
              ((cmMakefileExecutableTargetGenerator *)this,tgt);
  }
  else {
    this = (cmMakefileLibraryTargetGenerator *)0x0;
  }
  return &this->super_cmMakefileTargetGenerator;
}

Assistant:

cmMakefileTargetGenerator *
cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)
{
  cmMakefileTargetGenerator *result = 0;

  switch (tgt->GetType())
    {
    case cmTarget::EXECUTABLE:
      result = new cmMakefileExecutableTargetGenerator(tgt);
      break;
    case cmTarget::STATIC_LIBRARY:
    case cmTarget::SHARED_LIBRARY:
    case cmTarget::MODULE_LIBRARY:
    case cmTarget::OBJECT_LIBRARY:
      result = new cmMakefileLibraryTargetGenerator(tgt);
      break;
    case cmTarget::UTILITY:
      result = new cmMakefileUtilityTargetGenerator(tgt);
      break;
    default:
      return result;
      // break; /* unreachable */
    }
  return result;
}